

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalExport::GetData
          (PhysicalExport *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ostream *poVar1;
  GlobalSourceState *pGVar2;
  ClientContext *context_00;
  pointer pcVar3;
  pointer pbVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var5;
  PhysicalExport *pPVar6;
  pointer prVar7;
  int iVar8;
  pointer pCVar9;
  Catalog *catalog;
  undefined4 extraout_var;
  pointer pCVar10;
  pointer pBVar11;
  reference pvVar12;
  type pCVar13;
  ostream *poVar14;
  reference pvVar15;
  ulong uVar16;
  iterator iVar17;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar18;
  pointer pbVar19;
  pointer prVar20;
  case_insensitive_map_t<vector<Value>_> *this_00;
  SQLString *in_R8;
  FileSystem *this_01;
  _Hash_node_base *p_Var21;
  size_type __n;
  bool bVar22;
  optional_ptr<duckdb::DependencyManager,_true> dependency_manager;
  ExportedTableData exported_table_info;
  string file_path;
  stringstream load_ss;
  stringstream ss;
  string local_570;
  Value local_550;
  ulong local_510;
  PhysicalExport *local_508;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *local_500;
  catalog_entry_vector_t local_4f8;
  FileSystem *local_4d8;
  type local_4d0;
  optional_ptr<duckdb::DependencyManager,_true> local_4c8;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  undefined1 local_4a4;
  GlobalSourceState *local_4a0;
  string local_498;
  string local_478;
  undefined1 local_458 [32];
  string local_438;
  _Alloc_hider local_418;
  char local_408 [16];
  _Alloc_hider local_3f8;
  size_type local_3f0;
  char local_3e8 [16];
  pointer local_3d8;
  pointer local_3d0;
  string local_3c0;
  key_type local_3a0;
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  string local_360;
  undefined1 local_340 [128];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [16];
  pointer local_1a8;
  ios_base aiStack_138 [264];
  
  pGVar2 = input->global_state;
  if (*(char *)&pGVar2[1]._vptr_GlobalSourceState == '\0') {
    context_00 = context->client;
    local_4d8 = FileSystem::GetFileSystem(context_00);
    local_500 = &this->info;
    pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (local_500);
    catalog = Catalog::GetCatalog(context_00,&pCVar9->catalog);
    local_4f8.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetNaiveExportOrder((catalog_entry_vector_t *)local_1b8,context->client,catalog);
    prVar7 = local_4f8.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_4f8.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
    local_4f8.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
    local_4f8.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a8;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    if ((prVar7 != (pointer)0x0) &&
       (operator_delete(prVar7), (pointer)local_1b8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_1b8._0_8_);
    }
    iVar8 = (*catalog->_vptr_Catalog[0x1a])(catalog);
    local_4c8.ptr = (DependencyManager *)CONCAT44(extraout_var,iVar8);
    if (local_4c8.ptr != (DependencyManager *)0x0) {
      optional_ptr<duckdb::DependencyManager,_true>::CheckValid(&local_4c8);
      DependencyManager::ReorderEntries(local_4c8.ptr,&local_4f8,context_00);
    }
    local_508 = this;
    local_4a0 = pGVar2;
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    prVar7 = local_4f8.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_4f8.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_4f8.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      prVar20 = local_4f8.
                super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (prVar20->_M_data->internal == false) {
          (*prVar20->_M_data->_vptr_CatalogEntry[8])
                    ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                      *)local_458);
          pCVar10 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                    operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                *)local_458);
          (pCVar10->catalog)._M_string_length = 0;
          *(pCVar10->catalog)._M_dataplus._M_p = '\0';
          pCVar10 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                    operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                *)local_458);
          (*(pCVar10->super_ParseInfo)._vptr_ParseInfo[5])(local_340,pCVar10);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)CONCAT71(local_340._1_7_,local_340[0]),
                     local_340._8_8_);
          if ((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]) != local_340 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]));
          }
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,";\n",2);
          if ((CreateInfo *)local_458._0_8_ != (CreateInfo *)0x0) {
            (*((ParseInfo *)local_458._0_8_)->_vptr_ParseInfo[1])();
          }
        }
        prVar20 = prVar20 + 1;
      } while (prVar20 != prVar7);
    }
    local_340[0] = (stringstream)0xa;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,local_340,1);
    pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (local_500);
    this_01 = local_4d8;
    local_458._0_8_ = (long)local_458 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"schema.sql","");
    pPVar6 = local_508;
    FileSystem::JoinPath
              ((string *)local_340,this_01,(string *)&pCVar9->file_path,(string *)local_458);
    WriteStringStreamToFile(this_01,(stringstream *)local_1b8,(string *)local_340);
    if ((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]) != local_340 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]));
    }
    if (local_458._0_8_ != (long)local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_);
    }
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    local_508 = (PhysicalExport *)&pPVar6->exported_tables;
    poVar1 = (ostream *)(local_340 + 0x10);
    local_510 = 0;
    while (pBVar11 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                     ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                                   *)local_508),
          local_510 <
          (ulong)(((long)(pBVar11->data).
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         .
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar11->data).
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         .
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333)) {
      pBVar11 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                              *)local_508);
      pvVar12 = vector<duckdb::ExportedTableInfo,_true>::operator[](&pBVar11->data,local_510);
      ExportedTableData::ExportedTableData((ExportedTableData *)local_458,&pvVar12->table_data);
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                          (local_500);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"COPY ",5);
      iVar8 = ::std::__cxx11::string::compare((char *)&local_438);
      if ((iVar8 != 0) && (local_438._M_string_length != 0)) {
        KeywordHelper::WriteOptionallyQuoted((string *)&local_550,&local_438,'\"',true);
        poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar1,(char *)local_550.type_._0_8_,
                             (long)local_550.type_.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
            &local_550.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_550.type_._0_8_);
        }
      }
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_478,local_3f8._M_p,local_3f8._M_p + local_3f0);
      local_550.type_._0_8_ =
           &local_550.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_2_
           = 0x5c;
      local_550.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&DAT_00000001;
      local_570.field_2._M_allocated_capacity._0_2_ = 0x2f;
      local_570._M_string_length = 1;
      local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
      StringUtil::Replace(&local_360,&local_478,(string *)&local_550,&local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
          &local_550.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_550.type_._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
      local_4c0 = &local_4b0;
      local_4b0 = 0x204d4f5246207325;
      local_4a8 = 0x28207325;
      local_4b8 = 0xc;
      local_4a4 = 0;
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_498,local_458._0_8_,(pointer)(local_458._0_8_ + local_458._8_8_));
      local_380[0] = local_370;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_380,local_360._M_dataplus._M_p,
                 local_360._M_dataplus._M_p + local_360._M_string_length);
      StringUtil::Format<duckdb::SQLIdentifier,duckdb::SQLString>
                ((string *)&local_550,(StringUtil *)&local_4c0,&local_498,(SQLIdentifier *)local_380
                 ,in_R8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)local_550.type_._0_8_,
                 (long)local_550.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
          &local_550.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_550.type_._0_8_);
      }
      if (local_380[0] != local_370) {
        operator_delete(local_380[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p);
      }
      if (local_4c0 != &local_4b0) {
        operator_delete(local_4c0);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FORMAT \'",8);
      poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,(pCVar13->format)._M_dataplus._M_p,
                           (pCVar13->format)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'",1);
      local_4d0 = pCVar13;
      iVar8 = ::std::__cxx11::string::compare((char *)&pCVar13->format);
      if (iVar8 == 0) {
        this_00 = &local_4d0->options;
        pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_550.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'e';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = 'r';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x6568;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x6461;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x6;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _6_1_ = '\0';
        local_550.type_._0_8_ = pp_Var5;
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_550);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_550.type_._0_8_ != pp_Var5) {
          operator_delete((void *)local_550.type_._0_8_);
        }
        if (iVar17.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
          local_570.field_2._M_local_buf[4] = 'e';
          local_570.field_2._M_local_buf[5] = 'r';
          local_570.field_2._M_allocated_capacity._0_2_ = 0x6568;
          local_570.field_2._M_local_buf[2] = 'a';
          local_570.field_2._M_local_buf[3] = 'd';
          local_570._M_string_length = 6;
          local_570.field_2._M_local_buf[6] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_570);
          Value::INTEGER(&local_550,1);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_550);
          Value::~Value(&local_550);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._M_dataplus._M_p != &local_570.field_2) {
            operator_delete(local_570._M_dataplus._M_p);
          }
        }
        local_550.type_._0_8_ =
             &local_550.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x6564;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x696c;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'm';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = 'i';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _6_1_ = 't';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = 'e';
        local_550.is_null = true;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x9;
        local_550._25_1_ = '\0';
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_550);
        if (iVar17.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
          local_570.field_2._M_local_buf[2] = 'p';
          local_570.field_2._M_allocated_capacity._0_2_ = 0x6573;
          local_570._M_string_length = 3;
          local_570.field_2._M_local_buf[3] = '\0';
          iVar17 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this_00->_M_h,(key_type *)&local_570);
          if (iVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_3a0.field_2._M_local_buf[4] = 'm';
            local_3a0.field_2._M_allocated_capacity._0_4_ = 0x696c6564;
            local_3a0._M_string_length = 5;
            local_3a0.field_2._M_local_buf[5] = '\0';
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            iVar17 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this_00->_M_h,&local_3a0);
            bVar22 = iVar17.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
                     ._M_cur == (__node_type *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              operator_delete(local_3a0._M_dataplus._M_p);
            }
          }
          else {
            bVar22 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._M_dataplus._M_p != &local_570.field_2) {
            operator_delete(local_570._M_dataplus._M_p);
          }
        }
        else {
          bVar22 = false;
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
            &local_550.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_550.type_._0_8_);
        }
        if (bVar22) {
          local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
          local_570.field_2._M_allocated_capacity._0_2_ = 0x6564;
          local_570.field_2._M_local_buf[2] = 'l';
          local_570.field_2._M_local_buf[3] = 'i';
          local_570.field_2._M_local_buf[4] = 'm';
          local_570.field_2._M_local_buf[5] = 'i';
          local_570.field_2._M_local_buf[6] = 't';
          local_570.field_2._M_local_buf[7] = 'e';
          local_570.field_2._M_local_buf[8] = 'r';
          local_570._M_string_length = 9;
          local_570.field_2._M_local_buf[9] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_570);
          Value::Value(&local_550,",");
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_550);
          Value::~Value(&local_550);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._M_dataplus._M_p != &local_570.field_2) {
            operator_delete(local_570._M_dataplus._M_p);
          }
        }
        pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_550.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'e';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x7571;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x746f;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_00000005;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = '\0';
        local_550.type_._0_8_ = pp_Var5;
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_550);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_550.type_._0_8_ != pp_Var5) {
          operator_delete((void *)local_550.type_._0_8_);
        }
        if (iVar17.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
          local_570.field_2._M_local_buf[4] = 'e';
          local_570.field_2._M_allocated_capacity._0_2_ = 0x7571;
          local_570.field_2._M_local_buf[2] = 'o';
          local_570.field_2._M_local_buf[3] = 't';
          local_570._M_string_length = 5;
          local_570.field_2._M_local_buf[5] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_570);
          Value::Value(&local_550,"\"");
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_550);
          Value::~Value(&local_550);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._M_dataplus._M_p != &local_570.field_2) {
            operator_delete(local_570._M_dataplus._M_p);
          }
        }
        pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_550.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_550.is_null = true;
        local_550._25_1_ = '_';
        local_550._26_4_ = 0x6c6c756e;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x6f66;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x6372;
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'e';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = '_';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _6_1_ = 'n';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = 'o';
        local_550.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0xe;
        local_550._30_1_ = '\0';
        local_550.type_._0_8_ = pp_Var5;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&this_00->_M_h,&local_550);
        pbVar19 = local_3d8;
        pbVar4 = local_3d0;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_550.type_._0_8_ != pp_Var5) {
          operator_delete((void *)local_550.type_._0_8_);
          pbVar19 = local_3d8;
          pbVar4 = local_3d0;
        }
        for (; pbVar19 != pbVar4; pbVar19 = pbVar19 + 1) {
          local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
          local_570.field_2._M_local_buf[8] = 't';
          local_570.field_2._M_local_buf[9] = '_';
          local_570.field_2._10_4_ = 0x6c6c756e;
          local_570.field_2._M_allocated_capacity._0_2_ = 0x6f66;
          local_570.field_2._M_local_buf[2] = 'r';
          local_570.field_2._M_local_buf[3] = 'c';
          local_570.field_2._M_local_buf[4] = 'e';
          local_570.field_2._M_local_buf[5] = '_';
          local_570.field_2._M_local_buf[6] = 'n';
          local_570.field_2._M_local_buf[7] = 'o';
          local_570._M_string_length = 0xe;
          local_570.field_2._M_local_buf[0xe] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_570);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          pcVar3 = (pbVar19->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,pcVar3,pcVar3 + pbVar19->_M_string_length);
          Value::Value(&local_550,&local_3c0);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_550);
          Value::~Value(&local_550);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570._M_dataplus._M_p != &local_570.field_2) {
            operator_delete(local_570._M_dataplus._M_p);
          }
        }
      }
      for (p_Var21 = (local_4d0->options)._M_h._M_before_begin._M_nxt;
          p_Var21 != (_Hash_node_base *)0x0; p_Var21 = p_Var21->_M_nxt) {
        iVar8 = ::std::__cxx11::string::compare((char *)(p_Var21 + 1));
        if (iVar8 != 0) {
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(p_Var21 + 5);
          if (p_Var21[5]._M_nxt == p_Var21[6]._M_nxt) {
            Value::Value(&local_550,1);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>(pvVar18,&local_550);
            Value::~Value(&local_550);
          }
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
          poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar1,(char *)p_Var21[1]._M_nxt,(long)p_Var21[2]._M_nxt);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
          if ((long)p_Var21[6]._M_nxt - (long)p_Var21[5]._M_nxt == 0x40) {
            pvVar15 = vector<duckdb::Value,_true>::operator[]
                                ((vector<duckdb::Value,_true> *)pvVar18,0);
            Value::ToSQLString_abi_cxx11_((string *)&local_550,pvVar15);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1,(char *)local_550.type_._0_8_,
                       (long)local_550.type_.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
                &local_550.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            {
              operator_delete((void *)local_550.type_._0_8_);
            }
          }
          else {
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
            if (p_Var21[6]._M_nxt != p_Var21[5]._M_nxt) {
              __n = 0;
              do {
                pvVar15 = vector<duckdb::Value,_true>::operator[]
                                    ((vector<duckdb::Value,_true> *)pvVar18,__n);
                Value::ToSQLString_abi_cxx11_((string *)&local_550,pvVar15);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,(char *)local_550.type_._0_8_,
                           (long)local_550.type_.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
                    &local_550.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount) {
                  operator_delete((void *)local_550.type_._0_8_);
                }
                uVar16 = (long)p_Var21[6]._M_nxt - (long)p_Var21[5]._M_nxt >> 6;
                if (__n != uVar16 - 1) {
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                  uVar16 = (long)p_Var21[6]._M_nxt - (long)p_Var21[5]._M_nxt >> 6;
                }
                __n = __n + 1;
              } while (__n < uVar16);
            }
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
          }
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
      this_01 = local_4d8;
      local_550.type_.id_ = 10;
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_550,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3d8);
      if (local_3f8._M_p != local_3e8) {
        operator_delete(local_3f8._M_p);
      }
      if (local_418._M_p != local_408) {
        operator_delete(local_418._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if ((CreateInfo *)local_458._0_8_ != (CreateInfo *)(local_458 + 0x10)) {
        operator_delete((void *)local_458._0_8_);
      }
      local_510 = local_510 + 1;
    }
    pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (local_500);
    local_550.type_._0_8_ =
         &local_550.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"load.sql","");
    FileSystem::JoinPath
              ((string *)local_458,this_01,(string *)&pCVar9->file_path,(string *)&local_550);
    WriteStringStreamToFile(this_01,(stringstream *)local_340,(string *)local_458);
    if ((CreateInfo *)local_458._0_8_ != (CreateInfo *)(local_458 + 0x10)) {
      operator_delete((void *)local_458._0_8_);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_550.type_._0_8_ !=
        &local_550.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_550.type_._0_8_);
    }
    *(undefined1 *)&local_4a0[1]._vptr_GlobalSourceState = 1;
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    ::std::ios_base::~ios_base(aiStack_2c0);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    ::std::ios_base::~ios_base(aiStack_138);
    if (local_4f8.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f8.
                      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalExport::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	auto &state = input.global_state.Cast<ExportSourceState>();
	if (state.finished) {
		return SourceResultType::FINISHED;
	}

	auto &ccontext = context.client;
	auto &fs = FileSystem::GetFileSystem(ccontext);

	auto &catalog = Catalog::GetCatalog(ccontext, info->catalog);

	catalog_entry_vector_t catalog_entries;
	catalog_entries = GetNaiveExportOrder(context.client, catalog);
	auto dependency_manager = catalog.GetDependencyManager();
	if (dependency_manager) {
		dependency_manager->ReorderEntries(catalog_entries, ccontext);
	}

	// write the schema.sql file
	stringstream ss;
	WriteCatalogEntries(ss, catalog_entries);
	WriteStringStreamToFile(fs, ss, fs.JoinPath(info->file_path, "schema.sql"));

	// write the load.sql file
	// for every table, we write COPY INTO statement with the specified options
	stringstream load_ss;
	for (idx_t i = 0; i < exported_tables->data.size(); i++) {
		auto exported_table_info = exported_tables->data[i].table_data;
		WriteCopyStatement(fs, load_ss, *info, exported_table_info, function);
	}
	WriteStringStreamToFile(fs, load_ss, fs.JoinPath(info->file_path, "load.sql"));
	state.finished = true;

	return SourceResultType::FINISHED;
}